

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

void __thiscall tcu::ThreadUtil::Operation::execute(Operation *this,Thread *thread)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Result RVar3;
  pointer pSVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  pSVar4 = (this->m_deps).
           super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = true;
  if (0 < (int)((ulong)((long)(this->m_deps).
                              super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) >> 4)) {
    lVar6 = 0;
    lVar5 = 0;
    bVar7 = true;
    do {
      RVar3 = Event::waitReady(*(Event **)((long)&pSVar4->m_ptr + lVar6));
      if (RVar3 != RESULT_OK) {
        bVar7 = false;
      }
      lVar5 = lVar5 + 1;
      pSVar4 = (this->m_deps).
               super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < (int)((ulong)((long)(this->m_deps).
                                         super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4)
                          >> 4));
  }
  RVar3 = RESULT_FAILED;
  if (bVar7) {
    RVar3 = RESULT_OK;
    (*this->_vptr_Operation[2])(this,thread);
  }
  Event::setResult((this->m_event).m_ptr,RVar3);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::_M_erase_at_end(&this->m_deps,
                    (this->m_deps).
                    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pSVar2 = (this->m_event).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_event).m_ptr = (Event *)0x0;
      (*((this->m_event).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_event).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_event).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_event).m_state = (SharedPtrStateBase *)0x0;
    }
    (this->m_event).m_ptr = (Event *)0x0;
    (this->m_event).m_state = (SharedPtrStateBase *)0x0;
  }
  return;
}

Assistant:

void Operation::execute (Thread& thread)
{
	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (m_deps[depNdx]->waitReady() != Event::RESULT_OK)
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			exec(thread);
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(Event::RESULT_FAILED);
			throw;
		}

		m_event->setResult(Event::RESULT_OK);
	}
	else
		// Some dependencies failed
		m_event->setResult(Event::RESULT_FAILED);

	// Release resources
	m_deps.clear();
	m_event = SharedPtr<Event>();
}